

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl_sv.c
# Opt level: O1

int64_t dtl_sv_to_i64(dtl_sv_t *self,_Bool *ok)

{
  ulong uVar1;
  ulong uVar2;
  _Bool _Var3;
  
  if (self == (dtl_sv_t *)0x0) {
switchD_0013e767_default:
    _Var3 = false;
    uVar2 = 0;
  }
  else {
    switch(self->u32Flags >> 4 & 0xf) {
    case 1:
      uVar2 = (ulong)(self->pAny->val).i32;
      break;
    case 2:
      uVar2 = (ulong)(self->pAny->val).u32;
      break;
    case 3:
      uVar2 = (self->pAny->val).i64;
      break;
    case 4:
      uVar1 = (self->pAny->val).i64;
      _Var3 = -1 < (long)uVar1;
      uVar2 = 0;
      if (_Var3) {
        uVar2 = uVar1;
      }
      goto LAB_0013e7c7;
    case 5:
      uVar2 = (ulong)(self->pAny->val).flt;
      break;
    case 6:
      uVar2 = (ulong)(self->pAny->val).dbl;
      break;
    case 7:
      uVar2 = (ulong)(self->pAny->val).cr;
      break;
    case 8:
      uVar2 = (ulong)(byte)(self->pAny->val).cr;
      break;
    default:
      goto switchD_0013e767_default;
    }
    _Var3 = true;
  }
LAB_0013e7c7:
  if (ok != (_Bool *)0x0) {
    *ok = _Var3;
  }
  return uVar2;
}

Assistant:

int64_t dtl_sv_to_i64(const dtl_sv_t *self, bool *ok)
{
   bool success = false;
   int64_t retval = 0u;

   if(self != 0)
   {
      switch(dtl_sv_type(self)){
      case DTL_SV_NONE:
         break;
      case DTL_SV_I32:
         retval = (int32_t)self->pAny->val.i32;
         success = true;
         break;
      case DTL_SV_U32:
         retval = (int64_t) self->pAny->val.u32;
         success = true;
         break;
      case DTL_SV_I64:
         retval = (int64_t)self->pAny->val.i64;
         success = true;
         break;
      case DTL_SV_U64:
         if (self->pAny->val.u64 <= INT64_MAX)
         {
            retval = (int64_t)self->pAny->val.i64;
            success = true;
         }
         break;
     case DTL_SV_FLT:
         retval = (int64_t) self->pAny->val.flt;
         success = true;
         break;
      case DTL_SV_DBL:
         retval = (int64_t) self->pAny->val.dbl;
         success = true;
         break;
     case DTL_SV_BOOL:
         retval = (int64_t) self->pAny->val.bl;
         success = true;
         break;
     case DTL_SV_CHAR:
        retval = (int64_t)self->pAny->val.cr;
        success = true;
        break;
      case DTL_SV_STR:
         break;
      case DTL_SV_PTR:
         break;
      case DTL_SV_DV:
         break;
      case DTL_SV_BYTES:
         break;
      case DTL_SV_BYTEARRAY:
         break;
      }
   }
   if (ok != 0)
   {
      *ok = success;
   }
   return retval;
}